

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O3

char * map2json_create(map2json_t *obj)

{
  s_map2json_tree *psVar1;
  s_stringlib_token *token;
  bool bVar2;
  map2json_tree_t *pmVar3;
  int iVar4;
  map2json_tree_t *pmVar5;
  stringlib_tokens_t *tokens;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  s_map2json_tree *psVar10;
  map2json_keyvalue_t *pmVar11;
  long lVar12;
  s_map2json_tree *psVar13;
  
  map2json_freeTreeMemory(obj->tree);
  pmVar5 = (map2json_tree_t *)malloc(0x40);
  pmVar5->next = (s_map2json_tree *)0x0;
  pmVar5->children = (s_map2json_tree *)0x0;
  pmVar5->arrayObjects = (s_map2json_tree *)0x0;
  pmVar5->type = JSMN_OBJECT;
  *(undefined4 *)&pmVar5->arrayId = 0xffffffff;
  *(undefined4 *)((long)&pmVar5->arrayId + 4) = 0xffffffff;
  *(undefined4 *)&pmVar5->maxArrayId = 0xffffffff;
  *(undefined4 *)((long)&pmVar5->maxArrayId + 4) = 0xffffffff;
  pmVar5->key = (char *)0x0;
  pmVar5->value = (char *)0x0;
  obj->tree = pmVar5;
  pmVar11 = obj->pairs;
  do {
    if (pmVar11 == (map2json_keyvalue_t *)0x0) {
      safe_strcpy(obj->buffer,"");
      map2json_createJsonString(obj->buffer,obj->tree);
      return obj->buffer->data;
    }
    tokens = stringlib_splitTokens(pmVar11->key,'.');
    pmVar3 = pmVar5;
    for (token = tokens; token != (stringlib_tokens_t *)0x0; token = token->next) {
      pcVar6 = stringlib_getToken(token,pmVar11->key);
      pcVar7 = strchr(pcVar6,0x5b);
      lVar12 = -1;
      bVar2 = true;
      if (((pcVar7 != (char *)0x0) && (pcVar8 = strchr(pcVar6,0x5d), pcVar7 != pcVar6)) &&
         (pcVar8 != (char *)0x0)) {
        sVar9 = strlen(pcVar7 + 1);
        pcVar8 = (char *)calloc(1,sVar9);
        memcpy(pcVar8,pcVar7 + 1,sVar9);
        pcVar8[sVar9 - 1] = '\0';
        if (pcVar7[1] == 'x') {
          free(pcVar8);
          lVar12 = -2;
        }
        else {
          iVar4 = atoi(pcVar8);
          free(pcVar8);
          lVar12 = (long)iVar4;
        }
        *pcVar7 = '\0';
        bVar2 = false;
      }
      for (psVar10 = pmVar3->children; psVar10 != (s_map2json_tree *)0x0; psVar10 = psVar10->next) {
        iVar4 = strcmp(psVar10->key,pcVar6);
        if (iVar4 == 0) {
          psVar13 = psVar10;
          if (!bVar2) goto LAB_00104b1f;
          goto LAB_00104b83;
        }
      }
      psVar10 = (s_map2json_tree *)malloc(0x40);
      psVar10->value = (char *)0x0;
      psVar10->next = (s_map2json_tree *)0x0;
      psVar10->children = (s_map2json_tree *)0x0;
      psVar10->arrayObjects = (s_map2json_tree *)0x0;
      psVar10->type = JSMN_OBJECT;
      *(undefined4 *)&psVar10->arrayId = 0xffffffff;
      *(undefined4 *)((long)&psVar10->arrayId + 4) = 0xffffffff;
      *(undefined4 *)&psVar10->maxArrayId = 0xffffffff;
      *(undefined4 *)((long)&psVar10->maxArrayId + 4) = 0xffffffff;
      pcVar7 = (char *)0x0;
      if (pcVar6 != (char *)0x0) {
        sVar9 = strlen(pcVar6);
        pcVar7 = (char *)calloc(1,sVar9 + 1);
        memcpy(pcVar7,pcVar6,sVar9);
      }
      psVar10->key = pcVar7;
      psVar10->next = pmVar3->children;
      pmVar3->children = psVar10;
      if (!bVar2) {
        psVar10->type = JSMN_ARRAY;
        psVar13 = psVar10;
LAB_00104b1f:
        psVar10 = psVar13;
        if (lVar12 != -2) {
          psVar1 = psVar13->arrayObjects;
          for (psVar10 = psVar1; psVar10 != (s_map2json_tree *)0x0; psVar10 = psVar10->arrayObjects)
          {
            if (psVar10->arrayId == lVar12) goto LAB_00104b83;
          }
          psVar10 = (s_map2json_tree *)malloc(0x40);
          psVar10->next = (s_map2json_tree *)0x0;
          psVar10->children = (s_map2json_tree *)0x0;
          psVar10->type = JSMN_OBJECT;
          psVar10->maxArrayId = -1;
          psVar10->key = (char *)0x0;
          psVar10->value = (char *)0x0;
          if (psVar13->maxArrayId < lVar12) {
            psVar13->maxArrayId = lVar12 + 1;
          }
          psVar10->arrayId = lVar12;
          psVar10->arrayObjects = psVar1;
          psVar13->arrayObjects = psVar10;
        }
      }
LAB_00104b83:
      free(pcVar6);
      pmVar3 = psVar10;
    }
    pcVar6 = pmVar11->value;
    if (pmVar3->type == JSMN_ARRAY) {
      iVar4 = atoi(pcVar6);
      pmVar3->maxArrayId = (long)iVar4;
    }
    else {
      iVar4 = stringlib_isInteger(pcVar6);
      if (((iVar4 == 0) && (iVar4 = strcmp(pcVar6,"null"), iVar4 != 0)) &&
         ((iVar4 = strcmp(pcVar6,"true"), iVar4 != 0 &&
          ((iVar4 = strcmp(pcVar6,"false"), iVar4 != 0 && (*pcVar6 != '\x1b')))))) {
        pmVar3->type = JSMN_STRING;
      }
      else {
        pmVar3->type = JSMN_PRIMITIVE;
        pmVar3->value = pcVar6;
        if (*pcVar6 != '\x1b') goto LAB_00104be3;
        pcVar6 = pcVar6 + 1;
      }
      pmVar3->value = pcVar6;
    }
LAB_00104be3:
    pmVar11 = pmVar11->next;
    stringlib_freeTokens(tokens);
  } while( true );
}

Assistant:

char *map2json_create(map2json_t *obj) {
	DEBUG_PUT("map2json_create([map2json_t *])... ");

	map2json_freeTreeMemory(obj->tree);

	map2json_createTree(obj);
	safe_strcpy(obj->buffer, "");
	map2json_createJsonString(obj->buffer, obj->tree);

	DEBUG_PUT("map2json_create([map2json_t *])... DONE");
	return obj->buffer->data;
}